

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,char *context_string)

{
  code *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ptls_message_emitter_t *ppVar4;
  int iVar5;
  size_t len;
  ulong uVar6;
  ptls_iovec_t pVar7;
  undefined8 local_228;
  char *local_218;
  size_t *local_200;
  size_t body_size;
  size_t body_size_1;
  size_t local_1a8;
  size_t datalen;
  uint8_t data [226];
  undefined1 local_aa [2];
  long lStack_a8;
  uint16_t algo;
  size_t body_start_1;
  size_t capacity_1;
  size_t sStack_90;
  uint16_t _v;
  size_t algo_off;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t local_68;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t sStack_40;
  int ret;
  size_t start_off;
  char *context_string_local;
  st_ptls_signature_algorithms_t *signature_algorithms_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  sStack_40 = emitter->buf->off;
  if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
    return 0;
  }
  _buf = (ptls_buffer_t *)emitter;
  start_off = (size_t)context_string;
  context_string_local = (char *)signature_algorithms;
  signature_algorithms_local = (st_ptls_signature_algorithms_t *)emitter;
  emitter_local = (ptls_message_emitter_t *)tls;
  _emitter._4_4_ = (*emitter->begin_message)(emitter);
  if (_emitter._4_4_ == 0) {
    _key_sched = (ptls_key_schedule_t *)_buf->base;
    mess_start = (size_t)emitter_local[2].buf;
    local_68 = *(size_t *)(_key_sched->secret + 0xc);
    capacity._7_1_ = 0xf;
    _emitter._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
    if (_emitter._4_4_ == 0) {
      body_start = 3;
      _emitter._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
      if (_emitter._4_4_ == 0) {
        sendbuf = *(ptls_buffer_t **)(_key_sched->secret + 0xc);
        algo_off = *(size_t *)signature_algorithms_local->list;
        sStack_90 = ((ptls_buffer_t *)algo_off)->off;
        capacity_1._6_2_ = 0;
        capacity_1._4_1_ = 0;
        capacity_1._5_1_ = 0;
        _emitter._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,(void *)((long)&capacity_1 + 4),2);
        if (_emitter._4_4_ == 0) {
          body_start_1 = 2;
          _emitter._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,"",2);
          if (_emitter._4_4_ == 0) {
            lStack_a8 = *(long *)(algo_off + 0x10);
            len = build_certificate_verify_signdata
                            ((uint8_t *)&datalen,(ptls_key_schedule_t *)emitter_local[2].buf,
                             (char *)start_off);
            ppVar4 = emitter_local;
            sVar3 = algo_off;
            pcVar1 = *(code **)emitter_local->buf[4].off;
            sVar2 = emitter_local->buf[4].off;
            if (((ulong)emitter_local[0xc].enc & 1) == 0) {
              local_200 = (size_t *)0x0;
            }
            else {
              local_200 = &emitter_local[0xf].record_header_length;
            }
            pVar7 = ptls_iovec_init(&datalen,len);
            if (context_string_local == (char *)0x0) {
              local_218 = (char *)0x0;
              local_228 = 0;
            }
            else {
              local_228 = *(undefined8 *)(context_string_local + 0x20);
              local_218 = context_string_local;
            }
            body_size_1 = (size_t)pVar7.base;
            local_1a8 = pVar7.len;
            _emitter._4_4_ =
                 (*pcVar1)(sVar2,ppVar4,local_200,local_aa,sVar3,local_218,body_size_1,local_1a8,
                           local_228);
            if (_emitter._4_4_ == 0) {
              if (emitter_local[0xf].record_header_length != 0) {
                __assert_fail("tls->server.async_job == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                              ,0xc92,
                              "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                             );
              }
              *(char *)(*(long *)algo_off + sStack_90) = local_aa[1];
              *(char *)(*(long *)algo_off + 1 + sStack_90) = local_aa[0];
              uVar6 = *(long *)(algo_off + 0x10) - lStack_a8;
              if (body_start_1 == 0xffffffffffffffff) {
                iVar5 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)algo_off,uVar6);
                if (iVar5 != 0) {
                  return iVar5;
                }
              }
              else {
                if ((body_start_1 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= uVar6)) {
                  return 0x20c;
                }
                for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  *(char *)(*(long *)algo_off + (lStack_a8 - body_start_1)) =
                       (char)(uVar6 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
              }
              _emitter._4_4_ = 0;
              uVar6 = *(long *)(_key_sched->secret + 0xc) - (long)sendbuf;
              if (body_start == 0xffffffffffffffff) {
                iVar5 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)_key_sched,uVar6);
                if (iVar5 != 0) {
                  return iVar5;
                }
              }
              else {
                if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar6))
                {
                  return 0x20c;
                }
                for (; body_start != 0; body_start = body_start - 1) {
                  *(char *)((long)sendbuf + (*(long *)_key_sched - body_start)) =
                       (char)(uVar6 >> (((char)body_start + -1) * '\b' & 0x3fU));
                }
              }
              _emitter._4_4_ = 0;
              if (mess_start != 0) {
                ptls__key_schedule_update_hash
                          ((ptls_key_schedule_t *)mess_start,
                           (uint8_t *)(*(long *)_key_sched + local_68),
                           *(long *)(_key_sched->secret + 0xc) - local_68,0);
              }
              _emitter._4_4_ = (*(code *)_buf[1].base)(_buf);
            }
            else if (_emitter._4_4_ == 0x20b) {
              if (((ulong)emitter_local[0xc].enc & 1) == 0) {
                __assert_fail("tls->is_server || !\"async operation only supported on the server-side\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                              ,0xc88,
                              "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                             );
              }
              if (emitter_local[0xf].record_header_length == 0) {
                __assert_fail("tls->server.async_job != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                              ,0xc89,
                              "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                             );
              }
              *(size_t *)(*(long *)signature_algorithms_local->list + 0x10) = sStack_40;
            }
            else if (emitter_local[0xf].record_header_length != 0) {
              __assert_fail("tls->server.async_job == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                            ,0xc8e,
                            "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                           );
            }
          }
        }
      }
    }
  }
  return _emitter._4_4_;
}

Assistant:

static int send_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms, const char *context_string)
{
    size_t start_off = emitter->buf->off;
    int ret;

    if (tls->ctx->sign_certificate == NULL)
        return 0;
    /* build and send CertificateVerify */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
        ptls_buffer_t *sendbuf = emitter->buf;
        size_t algo_off = sendbuf->off;
        ptls_buffer_push16(sendbuf, 0); /* filled in later */
        ptls_buffer_push_block(sendbuf, 2, {
            uint16_t algo;
            uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
            if ((ret = tls->ctx->sign_certificate->cb(
                     tls->ctx->sign_certificate, tls, tls->is_server ? &tls->server.async_job : NULL, &algo, sendbuf,
                     ptls_iovec_init(data, datalen), signature_algorithms != NULL ? signature_algorithms->list : NULL,
                     signature_algorithms != NULL ? signature_algorithms->count : 0)) != 0) {
                if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                    assert(tls->is_server || !"async operation only supported on the server-side");
                    assert(tls->server.async_job != NULL);
                    /* Reset the output to the end of the previous handshake message. CertificateVerify will be rebuilt when the
                     * async operation completes. */
                    emitter->buf->off = start_off;
                } else {
                    assert(tls->server.async_job == NULL);
                }
                goto Exit;
            }
            assert(tls->server.async_job == NULL);
            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
            sendbuf->base[algo_off + 1] = (uint8_t)algo;
        });
    });
Exit:
    return ret;
}